

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

MaybeResult<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::
memory<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
          (MaybeResult<wasm::WATParser::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  bool bVar1;
  bool bVar2;
  optional<unsigned_int> oVar3;
  _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *p_Var4;
  string *this;
  ParseInput *this_00;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  optional<unsigned_long> oVar5;
  undefined1 local_178 [8];
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> exports;
  MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames> import;
  string local_108;
  string local_e8;
  undefined1 local_c8 [8];
  Result<wasm::WATParser::Ok> type;
  undefined1 local_80 [8];
  optional<wasm::Name> id;
  __index_type local_60;
  undefined1 local_58 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> str;
  __index_type local_38;
  allocator<char> local_29;
  
  this_00 = &ctx->in;
  ParseInput::getPos(this_00);
  expected._M_str = "memory";
  expected._M_len = 6;
  bVar1 = ParseInput::takeSExprStart(this_00,expected);
  if (!bVar1) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
     + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  ParseInput::takeID((optional<wasm::Name> *)local_80,this_00);
  inlineExports((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_178,this_00);
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                     *)local_80,
                    (_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                     *)local_178);
  if (local_60 == '\x01') {
    std::__cxx11::string::string((string *)local_58,(string *)local_80);
    std::__detail::__variant::
    _Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>::
    _Variant_storage<2ul,wasm::WATParser::Err>
              ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>
                *)__return_storage_ptr__,local_58);
    std::__cxx11::string::~string((string *)local_58);
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                         *)local_80);
    goto LAB_00a5bc13;
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
  ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                       *)local_80);
  inlineImport((MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames> *)
               ((long)&exports.val.
                       super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                       .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> + 0x20)
               ,this_00);
  MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames>::MaybeResult
            ((MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames> *)local_80,
             (MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames> *)
             ((long)&exports.val.
                     super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                     .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> + 0x20));
  if (local_60 == '\x02') {
    std::__cxx11::string::string((string *)local_58,(string *)local_80);
    std::__detail::__variant::
    _Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>::
    _Variant_storage<2ul,wasm::WATParser::Err>
              ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>
                *)__return_storage_ptr__,local_58);
    std::__cxx11::string::~string((string *)local_58);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)local_80);
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)local_80);
    expected_00._M_str = "data";
    expected_00._M_len = 4;
    bVar1 = ParseInput::takeSExprStart(this_00,expected_00);
    if (bVar1) {
      if (import.val.
          super__Variant_base<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Move_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Move_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Variant_storage_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_u._24_1_ == '\x01') {
        do {
          ParseInput::takeString
                    ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_58,
                     this_00);
        } while (str.
                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                 ._M_payload._8_1_ != '\0');
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                          local_58,(_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>
                                    *)local_80);
        if (local_38 != '\x01') {
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_58)
          ;
          bVar2 = ParseInput::takeRParen(this_00);
          if (!bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_108,"expected end of inline data",
                       (allocator<char> *)local_c8);
            ParseInput::err((Err *)local_58,this_00,&local_108);
            std::__detail::__variant::
            _Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>::
            _Variant_storage<2ul,wasm::WATParser::Err>
                      ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>
                        *)__return_storage_ptr__,local_58);
            std::__cxx11::string::~string((string *)local_58);
            std::__cxx11::string::~string((string *)&local_108);
            goto LAB_00a5bbfe;
          }
          p_Var4 = (_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_80;
          goto LAB_00a5bb0c;
        }
        std::__cxx11::string::string((string *)local_c8,(string *)local_58);
        std::__detail::__variant::
        _Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>::
        _Variant_storage<2ul,wasm::WATParser::Err>
                  ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>
                    *)__return_storage_ptr__,local_c8);
        std::__cxx11::string::~string((string *)local_c8);
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                            local_58);
LAB_00a5bbfe:
        p_Var4 = (_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_80;
LAB_00a5bc02:
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>
        ::~_Variant_storage(p_Var4);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   ((long)&import.val.
                           super__Variant_base<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 0x20),"imported memories cannot have inline data",(allocator<char> *)local_58);
        ParseInput::err((Err *)local_80,this_00,
                        (string *)
                        ((long)&import.val.
                                super__Variant_base<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                        + 0x20));
        std::__detail::__variant::
        _Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>::
        _Variant_storage<2ul,wasm::WATParser::Err>
                  ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>
                    *)__return_storage_ptr__,local_80);
        std::__cxx11::string::~string((string *)local_80);
        this = (string *)
               ((long)&import.val.
                       super__Variant_base<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
               + 0x20);
LAB_00a5bb8b:
        std::__cxx11::string::~string((string *)this);
      }
    }
    else {
      expected_01._M_str = "i64";
      expected_01._M_len = 3;
      bVar2 = ParseInput::takeKeyword(this_00,expected_01);
      if (bVar2) {
        oVar5 = ParseInput::takeU64(this_00);
        if (((undefined1  [16])
             oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
            (undefined1  [16])0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     ((long)&type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                             .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                     0x20),"expected initial size",&local_29);
          ParseInput::err((Err *)local_58,this_00,
                          (string *)
                          ((long)&type.val.
                                  super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                  .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                  .super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                          + 0x20));
          std::__detail::__variant::_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err>
          ::_Variant_storage<1ul,wasm::WATParser::Err>
                    ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err> *)local_80,
                     local_58);
          goto LAB_00a5ba14;
        }
        ParseInput::takeU64(this_00);
LAB_00a5ba33:
        local_60 = '\0';
      }
      else {
        expected_02._M_str = "i32";
        expected_02._M_len = 3;
        ParseInput::takeKeyword(this_00,expected_02);
        oVar3 = ParseInput::takeU32(this_00);
        if (((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) {
          ParseInput::takeU32(this_00);
          goto LAB_00a5ba33;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20)
                   ,"expected initial size",&local_29);
        ParseInput::err((Err *)local_58,this_00,
                        (string *)
                        ((long)&type.val.
                                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                        0x20));
        std::__detail::__variant::_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err>::
        _Variant_storage<1ul,wasm::WATParser::Err>
                  ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err> *)local_80,
                   local_58);
LAB_00a5ba14:
        std::__cxx11::string::~string((string *)local_58);
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20)
                  );
      }
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_58,
                      (_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_80)
      ;
      if (local_38 == '\x01') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20)
                   ,(string *)local_58);
        std::__detail::__variant::_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err>::
        _Variant_storage<1ul,wasm::WATParser::Err>
                  ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err> *)local_c8,
                   (__index_type *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20)
                  );
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20)
                  );
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                            local_58);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                            local_58);
        expected_03._M_str = "shared";
        expected_03._M_len = 6;
        ParseInput::takeKeyword(this_00,expected_03);
        type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._24_1_ = 0;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                        local_80);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_80,
                      (_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_c8)
      ;
      if (local_60 == '\x01') {
        std::__cxx11::string::string((string *)local_58,(string *)local_80);
        std::__detail::__variant::
        _Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>::
        _Variant_storage<2ul,wasm::WATParser::Err>
                  ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>
                    *)__return_storage_ptr__,local_58);
        std::__cxx11::string::~string((string *)local_58);
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                            local_80);
        p_Var4 = (_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_c8;
        goto LAB_00a5bc02;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                        local_80);
      p_Var4 = (_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_c8;
LAB_00a5bb0c:
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
      ~_Variant_storage(p_Var4);
      bVar2 = ParseInput::takeRParen(this_00);
      if (!bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"expected end of memory declaration",
                   (allocator<char> *)local_58);
        ParseInput::err((Err *)local_80,this_00,&local_e8);
        std::__detail::__variant::
        _Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>::
        _Variant_storage<2ul,wasm::WATParser::Err>
                  ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>
                    *)__return_storage_ptr__,local_80);
        std::__cxx11::string::~string((string *)local_80);
        this = &local_e8;
        goto LAB_00a5bb8b;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                        local_80);
      if (bVar1) {
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                            local_80);
      }
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
       + 0x20) = '\0';
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
  ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                       *)((long)&exports.val.
                                 super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                                 .
                                 super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                                 .
                                 super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                                 .
                                 super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                                 .
                                 super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                         + 0x20));
LAB_00a5bc13:
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
  ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                       *)local_178);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> memory(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("memory"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto exports = inlineExports(ctx.in);
  CHECK_ERR(exports);

  auto import = inlineImport(ctx.in);
  CHECK_ERR(import);

  std::optional<typename Ctx::MemTypeT> mtype;
  std::optional<typename Ctx::DataStringT> data;
  if (ctx.in.takeSExprStart("data"sv)) {
    if (import) {
      return ctx.in.err("imported memories cannot have inline data");
    }
    auto datastr = datastring(ctx);
    CHECK_ERR(datastr);
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of inline data");
    }
    mtype = ctx.makeMemType(Type::i32, ctx.getLimitsFromData(*datastr), false);
    data = *datastr;
  } else {
    auto type = memtype(ctx);
    CHECK_ERR(type);
    mtype = *type;
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of memory declaration");
  }

  CHECK_ERR(ctx.addMemory(name, *exports, import.getPtr(), *mtype, pos));

  if (data) {
    CHECK_ERR(ctx.addImplicitData(std::move(*data)));
  }

  return Ok{};
}